

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_6::GetTerminalAttributeImpl
               (Stage *stage,Prim *prim,string *attr_name,Attribute *value,string *err,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *visited_paths)

{
  bool bVar1;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *__x;
  size_type sVar2;
  reference rhs;
  string *psVar3;
  value_type *ppPVar4;
  size_type sVar5;
  error_type *peVar6;
  Attribute *pAVar7;
  ostream *poVar8;
  undefined1 show_full_path;
  string local_15a0 [39];
  allocator local_1579;
  string local_1578 [32];
  fmt local_1558 [32];
  ostringstream local_1538 [8];
  ostringstream ss_e_6;
  string local_13c0 [39];
  allocator local_1399;
  string local_1398 [32];
  fmt local_1378 [32];
  ostringstream local_1358 [8];
  ostringstream ss_e_5;
  string local_11e0 [39];
  allocator local_11b9;
  string local_11b8 [32];
  fmt local_1198 [32];
  ostringstream local_1178 [8];
  ostringstream ss_e_4;
  string local_1000 [32];
  ostringstream local_fe0 [8];
  ostringstream ss_e_3;
  string local_e58 [32];
  string local_e38;
  allocator local_e11;
  string local_e10 [32];
  fmt local_df0 [32];
  ostringstream local_dd0 [8];
  ostringstream ss_e_2;
  undefined1 local_c58 [8];
  string abs_path;
  Prim *targetPrim;
  string local_c28;
  Path local_c08;
  undefined1 local_b38 [8];
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  targetPrimRet;
  string targetPrimPropName;
  string targetPrimPath;
  value_type target;
  allocator local_9d9;
  string local_9d8;
  string local_9b8;
  ostringstream local_998 [8];
  ostringstream ss_e_1;
  string local_820 [39];
  allocator local_7f9;
  string local_7f8 [32];
  fmt local_7d8 [32];
  ostringstream local_7b8 [8];
  ostringstream ss_e;
  undefined1 local_640 [8];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> pv;
  undefined1 local_620 [8];
  Property prop;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *visited_paths_local;
  string *err_local;
  Attribute *value_local;
  string *attr_name_local;
  Prim *prim_local;
  Stage *stage_local;
  
  prop._1496_8_ = visited_paths;
  Property::Property((Property *)local_620);
  psVar3 = err;
  bVar1 = GetProperty(prim,attr_name,(Property *)local_620,err);
  show_full_path = SUB81(psVar3,0);
  if (!bVar1) {
    stage_local._7_1_ = false;
    pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    goto LAB_007e1dbb;
  }
  bVar1 = Property::is_attribute_connection((Property *)local_620);
  if (bVar1) {
    pAVar7 = Property::get_attribute((Property *)local_620);
    __x = Attribute::connections(pAVar7);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_640,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)__x);
    bVar1 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::empty
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_640);
    if (bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_7b8);
      poVar8 = ::std::operator<<((ostream *)local_7b8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"GetTerminalAttributeImpl");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xae3);
      ::std::operator<<(poVar8," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_7f8,"Connection targetPath is empty for Attribute {}.",&local_7f9);
      fmt::format<std::__cxx11::string>
                (local_7d8,(string *)local_7f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_name);
      poVar8 = ::std::operator<<((ostream *)local_7b8,(string *)local_7d8);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::string::~string((string *)local_7d8);
      ::std::__cxx11::string::~string(local_7f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_820);
        ::std::__cxx11::string::~string(local_820);
      }
      stage_local._7_1_ = false;
      pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_7b8);
    }
    else {
      sVar2 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_640);
      if (sVar2 < 2) {
        rhs = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_640,0);
        Path::Path((Path *)((long)&targetPrimPath.field_2 + 8),rhs);
        psVar3 = Path::prim_part_abi_cxx11_((Path *)((long)&targetPrimPath.field_2 + 8));
        ::std::__cxx11::string::string
                  ((string *)(targetPrimPropName.field_2._M_local_buf + 8),(string *)psVar3);
        psVar3 = Path::prop_part_abi_cxx11_((Path *)((long)&targetPrimPath.field_2 + 8));
        ::std::__cxx11::string::string
                  ((string *)
                   &targetPrimRet.contained.
                    super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value,(string *)psVar3);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_c28,"",(allocator *)((long)&targetPrim + 7))
        ;
        Path::Path(&local_c08,(string *)((long)&targetPrimPropName.field_2 + 8),&local_c28);
        Stage::GetPrimAtPath_abi_cxx11_
                  ((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b38,stage,&local_c08);
        Path::~Path(&local_c08);
        ::std::__cxx11::string::~string((string *)&local_c28);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&targetPrim + 7));
        bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_b38);
        if (bVar1) {
          ppPVar4 = nonstd::expected_lite::
                    expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_b38);
          abs_path.field_2._8_8_ = *ppPVar4;
          Path::full_path_name_abi_cxx11_
                    ((string *)local_c58,(Path *)((long)&targetPrimPath.field_2 + 8));
          sVar5 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)prop._1496_8_,(key_type *)local_c58);
          if (sVar5 == 0) {
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)prop._1496_8_,(value_type_conflict *)local_c58);
            stage_local._7_1_ =
                 GetTerminalAttributeImpl
                           (stage,(Prim *)abs_path.field_2._8_8_,
                            (string *)
                            &targetPrimRet.contained.
                             super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value,value,err,
                            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)prop._1496_8_);
            pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_dd0);
            poVar8 = ::std::operator<<((ostream *)local_dd0,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"GetTerminalAttributeImpl");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xafe);
            ::std::operator<<(poVar8," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_e10,"Circular referencing detected. connectionTargetPath = {}",
                       &local_e11);
            tinyusdz::to_string_abi_cxx11_
                      (&local_e38,(tinyusdz *)(targetPrimPath.field_2._M_local_buf + 8),(Path *)0x1,
                       (bool)show_full_path);
            fmt::format<std::__cxx11::string>
                      (local_df0,(string *)local_e10,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_e38);
            poVar8 = ::std::operator<<((ostream *)local_dd0,(string *)local_df0);
            ::std::operator<<(poVar8,"\n");
            ::std::__cxx11::string::~string((string *)local_df0);
            ::std::__cxx11::string::~string((string *)&local_e38);
            ::std::__cxx11::string::~string(local_e10);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_e11);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_e58);
              ::std::__cxx11::string::~string(local_e58);
            }
            stage_local._7_1_ = false;
            pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_dd0);
          }
          ::std::__cxx11::string::~string((string *)local_c58);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_fe0);
          poVar8 = ::std::operator<<((ostream *)local_fe0,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"GetTerminalAttributeImpl");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb06);
          ::std::operator<<(poVar8," ");
          peVar6 = nonstd::expected_lite::
                   expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::error((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_b38);
          poVar8 = ::std::operator<<((ostream *)local_fe0,(string *)peVar6);
          ::std::operator<<(poVar8,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)err,local_1000);
            ::std::__cxx11::string::~string(local_1000);
          }
          stage_local._7_1_ = false;
          pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_fe0);
        }
        nonstd::expected_lite::
        expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~expected((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_b38);
        ::std::__cxx11::string::~string
                  ((string *)
                   &targetPrimRet.contained.
                    super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        ::std::__cxx11::string::~string((string *)(targetPrimPropName.field_2._M_local_buf + 8));
        Path::~Path((Path *)((long)&targetPrimPath.field_2 + 8));
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_998);
        poVar8 = ::std::operator<<((ostream *)local_998,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"GetTerminalAttributeImpl");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xae8);
        ::std::operator<<(poVar8," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_9d8,"Multiple targetPaths assigned to .connection.",&local_9d9);
        fmt::format(&local_9b8,&local_9d8);
        poVar8 = ::std::operator<<((ostream *)local_998,(string *)&local_9b8);
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::string::~string((string *)&local_9b8);
        ::std::__cxx11::string::~string((string *)&local_9d8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,(string *)&target._valid);
          ::std::__cxx11::string::~string((string *)&target._valid);
        }
        stage_local._7_1_ = false;
        pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_998);
      }
    }
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_640);
    if (pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_007e1dbb;
  }
  else {
    bVar1 = Property::is_relationship((Property *)local_620);
    if (bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_1178);
      poVar8 = ::std::operator<<((ostream *)local_1178,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"GetTerminalAttributeImpl");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb0a);
      ::std::operator<<(poVar8," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_11b8,"Property `{}` is a Relation.",&local_11b9);
      fmt::format<std::__cxx11::string>
                (local_1198,(string *)local_11b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_name);
      poVar8 = ::std::operator<<((ostream *)local_1178,(string *)local_1198);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::string::~string((string *)local_1198);
      ::std::__cxx11::string::~string(local_11b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_11b9);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_11e0);
        ::std::__cxx11::string::~string(local_11e0);
      }
      stage_local._7_1_ = false;
      pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_1178);
      goto LAB_007e1dbb;
    }
    bVar1 = Property::is_empty((Property *)local_620);
    if (bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_1358);
      poVar8 = ::std::operator<<((ostream *)local_1358,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"GetTerminalAttributeImpl");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb0e);
      ::std::operator<<(poVar8," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1398,"Attribute `{}` is a define-only attribute(no value assigned).",
                 &local_1399);
      fmt::format<std::__cxx11::string>
                (local_1378,(string *)local_1398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_name);
      poVar8 = ::std::operator<<((ostream *)local_1358,(string *)local_1378);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::string::~string((string *)local_1378);
      ::std::__cxx11::string::~string(local_1398);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1399);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_13c0);
        ::std::__cxx11::string::~string(local_13c0);
      }
      stage_local._7_1_ = false;
      pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_1358);
      goto LAB_007e1dbb;
    }
    bVar1 = Property::is_attribute((Property *)local_620);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_1538);
      poVar8 = ::std::operator<<((ostream *)local_1538,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"GetTerminalAttributeImpl");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0xb15);
      ::std::operator<<(poVar8," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1578,"[InternalError] Invalid Attribute `{}`.",&local_1579);
      fmt::format<std::__cxx11::string>
                (local_1558,(string *)local_1578,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_name);
      poVar8 = ::std::operator<<((ostream *)local_1538,(string *)local_1558);
      ::std::operator<<(poVar8,"\n");
      ::std::__cxx11::string::~string((string *)local_1558);
      ::std::__cxx11::string::~string(local_1578);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1579);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_15a0);
        ::std::__cxx11::string::~string(local_15a0);
      }
      stage_local._7_1_ = false;
      pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_1538);
      goto LAB_007e1dbb;
    }
    pAVar7 = Property::get_attribute((Property *)local_620);
    Attribute::operator=(value,pAVar7);
  }
  stage_local._7_1_ = true;
  pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_007e1dbb:
  Property::~Property((Property *)local_620);
  return stage_local._7_1_;
}

Assistant:

bool GetTerminalAttributeImpl(const tinyusdz::Stage &stage,
                              const tinyusdz::Prim &prim,
                              const std::string &attr_name, Attribute *value,
                              std::string *err,
                              std::set<std::string> &visited_paths) {
  DCOUT("Prim : " << prim.element_path().element_name() << "("
                  << prim.type_name() << ") attr_name " << attr_name);

  Property prop;
  if (!GetProperty(prim, attr_name, &prop, err)) {
    return false;
  }

  if (prop.is_attribute_connection()) {
    // Follow connection target Path(singple targetPath only).
    std::vector<Path> pv = prop.get_attribute().connections();
    if (pv.empty()) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Connection targetPath is empty for Attribute {}.", attr_name));
    }

    if (pv.size() > 1) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Multiple targetPaths assigned to .connection."));
    }

    auto target = pv[0];

    std::string targetPrimPath = target.prim_part();
    std::string targetPrimPropName = target.prop_part();
    DCOUT("connection targetPath : " << target << "(Prim: " << targetPrimPath
                                     << ", Prop: " << targetPrimPropName
                                     << ")");

    auto targetPrimRet =
        stage.GetPrimAtPath(Path(targetPrimPath, /* prop */ ""));
    if (targetPrimRet) {
      // Follow the connetion
      const Prim *targetPrim = targetPrimRet.value();

      std::string abs_path = target.full_path_name();

      if (visited_paths.count(abs_path)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Circular referencing detected. connectionTargetPath = {}",
            to_string(target)));
      }
      visited_paths.insert(abs_path);

      return GetTerminalAttributeImpl(stage, *targetPrim, targetPrimPropName,
                                      value, err, visited_paths);

    } else {
      PUSH_ERROR_AND_RETURN(targetPrimRet.error());
    }
  } else if (prop.is_relationship()) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Property `{}` is a Relation.", attr_name));
  } else if (prop.is_empty()) {
    PUSH_ERROR_AND_RETURN(fmt::format(
        "Attribute `{}` is a define-only attribute(no value assigned).",
        attr_name));
  } else if (prop.is_attribute()) {
    (*value) = prop.get_attribute();

  } else {
    // ???
    PUSH_ERROR_AND_RETURN(
        fmt::format("[InternalError] Invalid Attribute `{}`.", attr_name));
  }

  return true;
}